

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O1

void __thiscall CMenus::DoIcon(CMenus *this,int ImageId,int SpriteId,CUIRect *pRect,vec4 *pColor)

{
  float fVar1;
  IGraphics *pIVar2;
  long in_FS_OFFSET;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x13])
            (pIVar2,(ulong)(uint)g_pData->m_aImages[ImageId].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,SpriteId,0,0,0);
  if (pColor != (vec4 *)0x0) {
    fVar1 = (pColor->field_3).w;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              ((pColor->field_0).x * fVar1,(pColor->field_1).y * fVar1,(pColor->field_2).z * fVar1);
  }
  local_38 = pRect->x;
  fStack_34 = pRect->y;
  fStack_30 = pRect->w;
  fStack_2c = pRect->h;
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,&local_38,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMenus::DoIcon(int ImageId, int SpriteId, const CUIRect *pRect, const vec4 *pColor)
{
	Graphics()->TextureSet(g_pData->m_aImages[ImageId].m_Id);

	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(SpriteId);
	if(pColor)
	{
		Graphics()->SetColor(pColor->r*pColor->a, pColor->g*pColor->a, pColor->b*pColor->a, pColor->a);
	}
	IGraphics::CQuadItem QuadItem(pRect->x, pRect->y, pRect->w, pRect->h);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();
}